

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O1

my_set<unsigned_long> * __thiscall
merlin::my_set<unsigned_long>::operator/
          (my_set<unsigned_long> *__return_storage_ptr__,my_set<unsigned_long> *this,
          unsigned_long *b)

{
  ulong *puVar1;
  ulong uVar2;
  pointer puVar3;
  long lVar4;
  ulong *__src;
  size_type __new_size;
  size_t __n;
  ulong *__dest;
  value_type_conflict1 local_28;
  
  my_set(__return_storage_ptr__,10);
  local_28 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__,
             (long)(this->super_my_vector<unsigned_long>).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->super_my_vector<unsigned_long>).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_28);
  __src = (this->super_my_vector<unsigned_long>).
          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start;
  puVar1 = (this->super_my_vector<unsigned_long>).
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __dest = (__return_storage_ptr__->super_my_vector<unsigned_long>).
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (__src != puVar1) {
    lVar4 = 0;
    do {
      uVar2 = *__src;
      if (uVar2 < *(ulong *)((long)b + lVar4)) {
        *__dest = uVar2;
        __src = __src + 1;
        __dest = __dest + 1;
      }
      else {
        if (uVar2 <= *(ulong *)((long)b + lVar4)) {
          __src = __src + 1;
        }
        lVar4 = lVar4 + 8;
      }
    } while ((__src != puVar1) && (lVar4 != 8));
  }
  __n = (long)puVar1 - (long)__src;
  if (__n != 0) {
    memmove(__dest,__src,__n);
  }
  puVar3 = (__return_storage_ptr__->super_my_vector<unsigned_long>).
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = (long)((long)__dest + __n) - (long)puVar3 >> 3;
  (__return_storage_ptr__->super_my_vector<unsigned_long>).m_n = __new_size;
  if ((pointer)((long)__dest + __n) == puVar3) {
    if ((__return_storage_ptr__->super_my_vector<unsigned_long>).
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      (__return_storage_ptr__->super_my_vector<unsigned_long>).
      super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
    }
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__,
               __new_size);
  }
  return __return_storage_ptr__;
}

Assistant:

my_set<T> my_set<T>::operator/(const T& b) const {
	my_set<T> d;
	size_t n = size();
	d.resize(n);                                    // reserve enough space
	typename my_set<T>::iterator dend;
	dend = std::set_difference(begin(), end(), &b, (&b) + 1, d._begin()); // use stl set function
	d.m_n = dend - d.begin();
	d.update();
	return d;
}